

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O2

LogLevel phosg::enum_for_name<phosg::LogLevel>(char *name)

{
  int iVar1;
  LogLevel LVar2;
  invalid_argument *this;
  
  iVar1 = strcmp(name,"USE_DEFAULT");
  if (iVar1 == 0) {
    LVar2 = USE_DEFAULT;
  }
  else {
    iVar1 = strcmp(name,"DEBUG");
    if (iVar1 == 0) {
      LVar2 = DEBUG;
    }
    else {
      iVar1 = strcmp(name,"INFO");
      if (iVar1 == 0) {
        LVar2 = INFO;
      }
      else {
        iVar1 = strcmp(name,"WARNING");
        if (iVar1 == 0) {
          LVar2 = WARNING;
        }
        else {
          iVar1 = strcmp(name,"ERROR");
          if (iVar1 == 0) {
            LVar2 = ERROR;
          }
          else {
            iVar1 = strcmp(name,"DISABLED");
            if (iVar1 != 0) {
              this = (invalid_argument *)__cxa_allocate_exception(0x10);
              ::std::invalid_argument::invalid_argument(this,"invalid LogLevel name");
              __cxa_throw(this,&::std::invalid_argument::typeinfo,
                          ::std::invalid_argument::~invalid_argument);
            }
            LVar2 = DISABLED;
          }
        }
      }
    }
  }
  return LVar2;
}

Assistant:

LogLevel enum_for_name<LogLevel>(const char* name) {
  if (!strcmp(name, "USE_DEFAULT")) {
    return LogLevel::USE_DEFAULT;
  } else if (!strcmp(name, "DEBUG")) {
    return LogLevel::DEBUG;
  } else if (!strcmp(name, "INFO")) {
    return LogLevel::INFO;
  } else if (!strcmp(name, "WARNING")) {
    return LogLevel::WARNING;
  } else if (!strcmp(name, "ERROR")) {
    return LogLevel::ERROR;
  } else if (!strcmp(name, "DISABLED")) {
    return LogLevel::DISABLED;
  } else {
    throw invalid_argument("invalid LogLevel name");
  }
}